

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O1

int __thiscall Fl_Counter::handle(Fl_Counter *this,int event)

{
  Fl_Widget_Tracker FVar1;
  bool bVar2;
  uint uVar3;
  Fl_Widget *in_RAX;
  double dVar4;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_28;
  
  local_28.wp_ = in_RAX;
  switch(event) {
  case 1:
    bVar2 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar2) {
      Fl::focus((Fl_Widget *)this);
    }
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
    FVar1.wp_ = local_28.wp_;
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
    if (FVar1.wp_ == (Fl_Widget *)0x0) {
      return 1;
    }
  case 5:
    uVar3 = calc_mouseobj(this);
    if (uVar3 != this->mouseobj) {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = (uchar)uVar3;
      if (uVar3 != 0) {
        Fl::add_timeout(0.5,repeat_callback,this);
      }
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
      increment_cb(this);
      if (local_28.wp_ != (Fl_Widget *)0x0) {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
    }
    break;
  case 2:
    if (this->mouseobj != '\0') {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = '\0';
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    break;
  case 6:
  case 7:
    bVar2 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (!bVar2) {
      return 0;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    return 1;
  case 8:
    if (Fl::e_keysym == 0xff53) {
      dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,1);
      dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
      return 1;
    }
    if (Fl::e_keysym != 0xff51) {
      return 0;
    }
    dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,-1);
    dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
    break;
  default:
    return 0;
  }
  return 1;
}

Assistant:

int Fl_Counter::handle(int event) {
  int i;
  switch (event) {
  case FL_RELEASE:
    if (mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = 0;
      redraw();
    }
    handle_release();
    return 1;
  case FL_PUSH:
    if (Fl::visible_focus()) Fl::focus(this);
    { Fl_Widget_Tracker wp(this);
      handle_push();
      if (wp.deleted()) return 1;
    }
  case FL_DRAG:
    i = calc_mouseobj();
    if (i != mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = (uchar)i;
      if (i) Fl::add_timeout(INITIALREPEAT, repeat_callback, this);
      Fl_Widget_Tracker wp(this);
      increment_cb();
      if (wp.deleted()) return 1;
      redraw();
    }
    return 1;
  case FL_KEYBOARD :
    switch (Fl::event_key()) {
      case FL_Left:
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Right:
	handle_drag(clamp(increment(value(),1)));
	return 1;
      default:
        return 0;
    }
    // break not required because of switch...
  case FL_FOCUS : /* FALLTHROUGH */
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER : /* FALLTHROUGH */
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}